

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O2

uint32_t * internal_node_child(char *node,uint32_t child_num)

{
  uint32_t *puVar1;
  
  if (child_num <= *(uint *)(node + 6)) {
    puVar1 = (uint32_t *)(node + (ulong)(child_num * 8) + 0xe);
    if (*(uint *)(node + 6) == child_num) {
      puVar1 = (uint32_t *)(node + 10);
    }
    return puVar1;
  }
  printf("Tried to access child_num %d > num_keys %d\n");
  exit(1);
}

Assistant:

uint32_t *internal_node_child(char *node, uint32_t child_num) {
    uint32_t num_keys = *internal_node_num_keys(node);
    if (child_num > num_keys)
    {
        printf("Tried to access child_num %d > num_keys %d\n", child_num, num_keys);
        exit(EXIT_FAILURE);
    }
    else if (child_num == num_keys)
    {
        return internal_node_right_child(node);
    }
    else
    {
        return internal_node_cell(node, child_num);
    }
}